

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O1

bool __thiscall cmQtAutoGenInitializer::InitRcc(cmQtAutoGenInitializer *this)

{
  element_type *peVar1;
  bool bVar2;
  long lVar3;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"rcc","");
  bVar2 = GetQtExecutable(this,&(this->Rcc).super_GenVarsT,&local_38,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if ((bVar2) &&
     (peVar1 = (this->Rcc).super_GenVarsT.ExecutableFeatures.
               super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
     peVar1->Evaluated == false)) {
    if ((this->QtVersion).Major - 5 < 2) {
      lVar3 = std::__cxx11::string::find((char *)&peVar1->HelpOutput,0x545e1a,0);
      if (lVar3 == -1) {
        lVar3 = std::__cxx11::string::find((char *)&peVar1->HelpOutput,0x545e1b,0);
        if (lVar3 != -1) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[6]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &peVar1->ListOptions,(char (*) [6])0x545e1b);
        }
      }
      else {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[7]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &peVar1->ListOptions,(char (*) [7])"--list");
      }
    }
    peVar1->Evaluated = true;
  }
  return bVar2;
}

Assistant:

bool cmQtAutoGenInitializer::InitRcc()
{
  // Rcc executable
  {
    if (!this->GetQtExecutable(this->Rcc, "rcc", false)) {
      return false;
    }
    // Evaluate test output on demand
    CompilerFeatures& features = *this->Rcc.ExecutableFeatures;
    if (!features.Evaluated) {
      // Look for list options
      if (this->QtVersion.Major == 5 || this->QtVersion.Major == 6) {
        if (features.HelpOutput.find("--list") != std::string::npos) {
          features.ListOptions.emplace_back("--list");
        } else if (features.HelpOutput.find("-list") != std::string::npos) {
          features.ListOptions.emplace_back("-list");
        }
      }
      // Evaluation finished
      features.Evaluated = true;
    }
  }

  return true;
}